

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcOrderAction::~IfcOrderAction(IfcOrderAction *this)

{
  ~IfcOrderAction((IfcOrderAction *)
                  (&(this->super_IfcTask).field_0x0 +
                  *(long *)(*(long *)&this->super_IfcTask + -0x18)));
  return;
}

Assistant:

IfcOrderAction() : Object("IfcOrderAction") {}